

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O2

void Timidity::mix_voice(Renderer *song,float *buf,Voice *v,int c)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  BYTE BVar4;
  int iVar5;
  sample_t *psVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  SDWORD control_ratio;
  final_volume_t *ampat;
  int iVar10;
  uint uVar11;
  float fVar12;
  final_volume_t amp;
  float fVar13;
  float fVar14;
  float fVar15;
  int count;
  
  if (c < 0) {
    return;
  }
  count = c;
  if ((v->status & 8) != 0) {
    if (0x13 < (uint)c) {
      count = 0x14;
    }
    psVar6 = resample_voice(song,v,&count);
    iVar9 = 1;
    if (1 < (uint)count) {
      iVar9 = count;
    }
    fVar12 = v->left_mix;
    fVar14 = v->right_mix;
    if (fVar14 == 0.0) {
      fVar14 = -fVar12;
      uVar11 = -(uint)(fVar14 / (float)iVar9 == 0.0);
      lVar8 = 0;
      while ((count + (uint)(count == 0) != (int)lVar8 &&
             (fVar12 = fVar12 + (float)(uVar11 & 0xbf800000 |
                                       ~uVar11 & (uint)(fVar14 / (float)iVar9)), 0.0 <= fVar12))) {
        buf[lVar8 * 2] = psVar6[lVar8] * fVar12 + buf[lVar8 * 2];
        lVar8 = lVar8 + 1;
      }
    }
    else if (fVar12 == 0.0) {
      fVar12 = -fVar14 / (float)iVar9;
      uVar11 = -(uint)(fVar12 == 0.0);
      lVar8 = 0;
      while ((count + (uint)(count == 0) != (int)lVar8 &&
             (fVar14 = fVar14 + (float)(uVar11 & 0xbf800000 | ~uVar11 & (uint)fVar12), 0.0 <= fVar14
             ))) {
        buf[lVar8 * 2 + 1] = psVar6[lVar8 * 2 + 1] * fVar14 + buf[lVar8 * 2 + 1];
        lVar8 = lVar8 + 1;
      }
    }
    else {
      fVar13 = 1.0 / (float)iVar9;
      fVar15 = -fVar12 * fVar13;
      uVar11 = -(uint)(fVar15 == 0.0);
      fVar13 = fVar13 * fVar14;
      for (lVar8 = 0; count + (uint)(count == 0) != (int)lVar8; lVar8 = lVar8 + 1) {
        fVar12 = fVar12 + (float)(uVar11 & 0xbf800000 | ~uVar11 & (uint)fVar15);
        fVar14 = fVar14 - fVar13;
        if (0.0 <= fVar12) {
          if (fVar14 < 0.0) {
            fVar14 = 0.0;
          }
        }
        else {
          fVar12 = 0.0;
          if (fVar14 < 0.0) break;
        }
        fVar1 = psVar6[lVar8];
        buf[lVar8 * 2] = fVar1 * fVar12 + buf[lVar8 * 2];
        buf[lVar8 * 2 + 1] = fVar1 * fVar14 + buf[lVar8 * 2 + 1];
      }
    }
    v->status = '\0';
    return;
  }
  psVar6 = resample_voice(song,v,&count);
  if (count < 0) {
    return;
  }
  amp = v->right_mix;
  if (amp == 0.0) {
    if (((v->eg1).field_0.env.bUpdating != '\0') || (v->tremolo_phase_increment != 0)) {
      control_ratio = song->control_ratio;
      ampat = &v->left_mix;
LAB_0036fdf0:
      mix_single_signal(control_ratio,psVar6,buf,v,ampat,count);
      goto LAB_0036fe01;
    }
    amp = v->left_mix;
  }
  else {
    fVar12 = v->left_mix;
    BVar4 = (v->eg1).field_0.env.bUpdating;
    if (fVar12 != 0.0) {
      if ((BVar4 == '\0') && (v->tremolo_phase_increment == 0)) {
        for (lVar8 = 0; count != (int)lVar8; lVar8 = lVar8 + 1) {
          *(ulong *)(buf + lVar8 * 2) =
               CONCAT44((float)((ulong)*(undefined8 *)(buf + lVar8 * 2) >> 0x20) +
                        psVar6[lVar8] * amp,
                        (float)*(undefined8 *)(buf + lVar8 * 2) + psVar6[lVar8] * fVar12);
        }
      }
      else {
        iVar9 = song->control_ratio;
        iVar10 = count;
        iVar7 = v->control_counter;
        if (v->control_counter != 0) goto LAB_0036ff35;
        while (iVar5 = update_signal(v), iVar7 = iVar9, iVar5 == 0) {
LAB_0036ff35:
          if (iVar10 == 0) break;
          uVar2 = v->left_mix;
          uVar3 = v->right_mix;
          iVar5 = iVar7;
          if (iVar10 <= iVar7) {
            v->control_counter = iVar7 - iVar10;
            for (lVar8 = 0; iVar10 != (int)lVar8; lVar8 = lVar8 + 1) {
              *(ulong *)(buf + lVar8 * 2) =
                   CONCAT44((float)((ulong)*(undefined8 *)(buf + lVar8 * 2) >> 0x20) +
                            psVar6[lVar8] * (float)uVar3,
                            (float)*(undefined8 *)(buf + lVar8 * 2) + psVar6[lVar8] * (float)uVar2);
            }
            break;
          }
          while (iVar5 != 0) {
            fVar12 = *psVar6;
            psVar6 = psVar6 + 1;
            *(ulong *)buf =
                 CONCAT44((float)((ulong)*(undefined8 *)buf >> 0x20) + fVar12 * (float)uVar3,
                          (float)*(undefined8 *)buf + fVar12 * (float)uVar2);
            buf = buf + 2;
            iVar5 = iVar5 + -1;
          }
          iVar10 = iVar10 - iVar7;
        }
      }
      goto LAB_0036fe01;
    }
    if ((BVar4 != '\0') || (v->tremolo_phase_increment != 0)) {
      ampat = &v->right_mix;
      control_ratio = song->control_ratio;
      buf = buf + 1;
      goto LAB_0036fdf0;
    }
    buf = buf + 1;
  }
  mix_single(psVar6,buf,amp,count);
LAB_0036fe01:
  v->sample_count = v->sample_count + count;
  return;
}

Assistant:

void mix_voice(Renderer *song, float *buf, Voice *v, int c)
{
	int count = c;
	sample_t *sp;
	if (c < 0)
	{
		return;
	}
	if (v->status & VOICE_STOPPING)
	{
		if (count >= MAX_DIE_TIME)
			count = MAX_DIE_TIME;
		sp = resample_voice(song, v, &count);
		ramp_out(sp, buf, v, count);
		v->status = 0;
	}
	else
	{
		sp = resample_voice(song, v, &count);
		if (count < 0)
		{
			return;
		}
		if (v->right_mix == 0)			// All the way to the left
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment != 0)
			{
				mix_single_left_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_single_left(sp, buf, v, count);
			}
		}
		else if (v->left_mix == 0)		// All the way to the right
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment != 0)
			{
				mix_single_right_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_single_right(sp, buf, v, count);
			}
		}
		else							// Somewhere in the middle
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment)
			{
				mix_mystery_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_mystery(song->control_ratio, sp, buf, v, count);
			}
		}
		v->sample_count += count;
	}
}